

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O2

void __thiscall
EdExplFinder::debug_print(EdExplFinder *this,vector<int,_std::allocator<int>_> *shortestPathMatrix)

{
  uint uVar1;
  ostream *poVar2;
  int iVar3;
  int i;
  uint uVar4;
  int iVar5;
  char *__format;
  int i_2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "***************************************************************");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"shortest path matrix:");
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)&std::cout,"   ");
  for (uVar4 = 0; (int)uVar4 <= this->seqSize; uVar4 = uVar4 + 1) {
    printf("%2d ",(ulong)uVar4);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  for (iVar5 = 0; iVar5 < this->seqSize + 2; iVar5 = iVar5 + 1) {
    std::operator<<((ostream *)&std::cout,"---");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  for (uVar4 = 0; iVar5 = this->seqSize, (int)uVar4 <= iVar5; uVar4 = uVar4 + 1) {
    iVar3 = -1;
    while (iVar3 <= iVar5) {
      if (iVar3 + 1 == 0) {
        __format = "%2d|";
        uVar1 = uVar4;
      }
      else {
        uVar1 = (shortestPathMatrix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)(iVar3 + (iVar5 + 1) * uVar4)];
        __format = "%2d ";
      }
      printf(__format,(ulong)uVar1);
      iVar3 = iVar3 + 1;
      iVar5 = this->seqSize;
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "***************************************************************");
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void EdExplFinder::debug_print(std::vector<int>* shortestPathMatrix) const {
	std::cout << "***************************************************************" << '\n';

	std::cout << "shortest path matrix:" << '\n';

	std::cout << "   ";
	for (int i = 0; i < seqSize + 1; i++) {
		printf("%2d ", i);
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 2; i++) {
		std::cout << "---";
	}
	std::cout << '\n';

	for (int i = 0; i < seqSize + 1; i++) {
		for (int j = -1; j < seqSize + 1; j++) {
			if (j == -1) {
				printf("%2d|", i);
			} else {
				printf("%2d ", (*shortestPathMatrix)[matrixCoord(i, j)]);
			}
		}
		std::cout << '\n';
	}

	std::cout << "***************************************************************" << '\n';
}